

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O1

void __thiscall
PartsBupOutputter::newFace
          (PartsBupOutputter *this,Image *img,Point pos,string *name,
          vector<MaskRect,_std::allocator<MaskRect>_> *mask)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Blend BVar3;
  long *plVar4;
  size_type *psVar5;
  path local_f8;
  string *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  local_a0;
  string local_68;
  vector<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  (this->withFace).size = (this->base).size;
  std::vector<Color,_std::allocator<Color>_>::operator=
            (&(this->withFace).colorData,&(this->base).colorData);
  std::__cxx11::string::_M_replace
            ((ulong)&this->withMouthName,0,(char *)(this->withMouthName)._M_string_length,0x1163d1);
  this->mouthBlend = AlphaBlend;
  this->facePos = pos;
  if ((img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (img->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->withFaceName,0,(char *)(this->withFaceName)._M_string_length,0x1163d1);
    this->faceBlend = AlphaBlend;
  }
  else {
    local_c8 = name;
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector(&local_48,mask);
    Image::drawOnto(img,&this->withFace,pos,&local_48);
    if (local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
                            .super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
                            .super__Vector_impl_data._M_start);
    }
    local_f8._M_pathname._M_dataplus._M_p = (pointer)&local_f8._M_pathname.field_2;
    pcVar2 = (this->baseName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,pcVar2,pcVar2 + (this->baseName)._M_string_length);
    std::__cxx11::string::append((char *)&local_f8);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f8,(ulong)(local_c8->_M_dataplus)._M_p);
    paVar1 = &local_a0.first.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_a0.first.field_2._M_allocated_capacity = *psVar5;
      local_a0.first.field_2._8_8_ = plVar4[3];
      local_a0.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.first.field_2._M_allocated_capacity = *psVar5;
      local_a0.first._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_a0.first._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->withFaceName,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.first._M_dataplus._M_p,
                      local_a0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_pathname._M_dataplus._M_p != &local_f8._M_pathname.field_2) {
      operator_delete(local_f8._M_pathname._M_dataplus._M_p,
                      local_f8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    BVar3 = prepareImageInTmp(this,img,pos,mask,&this->base);
    this->faceBlend = BVar3;
    pcVar2 = (this->withFaceName)._M_dataplus._M_p;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar2,pcVar2 + (this->withFaceName)._M_string_length);
    std::__cxx11::string::append((char *)&local_c0);
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_f8,&local_c0,auto_format);
    std::filesystem::__cxx11::operator/((path *)&local_a0,&this->partsPath,&local_f8);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    Image::writePNG(&this->tmp,(path *)&local_a0,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::path::~path((path *)&local_a0);
    std::filesystem::__cxx11::path::~path(&local_f8);
    name = local_c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  local_f8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_pathname._M_string_length = 0;
  local_f8._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>,_true>
            (&local_a0,name,
             (vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
              *)&local_f8);
  std::
  vector<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>>
  ::
  emplace_back<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>
            ((vector<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<PartsBupOutputter::ImageEntry,std::allocator<PartsBupOutputter::ImageEntry>>>>>
              *)&this->expressions,&local_a0);
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  ~vector(&local_a0.second);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.first._M_dataplus._M_p != &local_a0.first.field_2) {
    operator_delete(local_a0.first._M_dataplus._M_p,local_a0.first.field_2._M_allocated_capacity + 1
                   );
  }
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  ~vector((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_> *)
          &local_f8);
  return;
}

Assistant:

void newFace(const Image& img, Point pos, const std::string &name, const std::vector<MaskRect>& mask) override {
		withFace = base;
		withMouthName = "";
		mouthBlend = Blend::AlphaBlend;
		facePos = pos;
		if (img.empty()) {
			withFaceName = "";
			faceBlend = Blend::AlphaBlend;
		}
		else {
			img.drawOnto(withFace, pos, mask);
			withFaceName = baseName + "_" + name;
			faceBlend = prepareImageInTmp(img, pos, mask, base);
			tmp.writePNG(partsPath/fs::u8path(withFaceName + ".png"));
		}
		expressions.push_back({name, {}});
	}